

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofiletools.cpp
# Opt level: O3

string * libcellml::sha1(string *__return_storage_ptr__,string *string)

{
  ulong uVar1;
  long lVar2;
  uint64_t uVar3;
  string *psVar4;
  ulong uVar5;
  long lVar6;
  uint64_t transforms;
  string buffer;
  array<unsigned_int,_5UL> digest;
  array<unsigned_int,_16UL> block;
  ostringstream result;
  istringstream is;
  undefined1 auStack_3b8 [8];
  uint64_t local_3b0;
  string *local_3a8;
  ulong local_3a0;
  undefined1 local_398 [32];
  undefined4 local_378;
  string *local_370;
  array<unsigned_int,_16UL> local_368;
  long local_328 [3];
  uint auStack_310 [22];
  ios_base local_2b8 [112];
  char acStack_248 [152];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_398._16_8_ = 0xefcdab8967452301;
  local_398._24_8_ = 0x1032547698badcfe;
  local_378 = 0xc3d2e1f0;
  local_3a8 = (string *)local_398;
  local_3a0 = 0;
  local_398[0] = 0;
  local_3b0 = 0;
  local_370 = __return_storage_ptr__;
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)string,_S_in);
  while( true ) {
    auStack_310[6] = 0;
    auStack_310[7] = 0;
    auStack_310[8] = 0;
    auStack_310[9] = 0;
    auStack_310[2] = 0;
    auStack_310[3] = 0;
    auStack_310[4] = 0;
    auStack_310[5] = 0;
    local_328[2] = 0;
    auStack_310[0] = 0;
    auStack_310[1] = 0;
    local_328[0] = 0;
    local_328[1] = 0;
    std::istream::read((char *)local_1b0,(long)local_328);
    std::__cxx11::string::append((char *)&local_3a8,(ulong)local_328);
    uVar1 = local_3a0;
    psVar4 = local_3a8;
    uVar3 = local_3b0;
    if (local_3a0 != 0x40) break;
    local_368._M_elems[0xc] = 0;
    local_368._M_elems[0xd] = 0;
    local_368._M_elems[0xe] = 0;
    local_368._M_elems[0xf] = 0;
    local_368._M_elems[8] = 0;
    local_368._M_elems[9] = 0;
    local_368._M_elems[10] = 0;
    local_368._M_elems[0xb] = 0;
    local_368._M_elems[4] = 0;
    local_368._M_elems[5] = 0;
    local_368._M_elems[6] = 0;
    local_368._M_elems[7] = 0;
    local_368._M_elems[0] = 0;
    local_368._M_elems[1] = 0;
    local_368._M_elems[2] = 0;
    local_368._M_elems[3] = 0;
    bufferToBlock(local_3a8,&local_368);
    transform((array<unsigned_int,_5UL> *)(local_398 + 0x10),&local_368,&local_3b0);
    local_3a0 = 0;
    *(undefined1 *)&(psVar4->_M_dataplus)._M_p = 0;
  }
  std::__cxx11::string::append((char *)&local_3a8);
  uVar5 = local_3a0;
  if (local_3a0 < 0x40) {
    do {
      std::__cxx11::string::push_back((char)&local_3a8);
    } while (local_3a0 < 0x40);
  }
  uVar1 = uVar3 * 0x200 + uVar1 * 8;
  local_368._M_elems[0xc] = 0;
  local_368._M_elems[0xd] = 0;
  local_368._M_elems[0xe] = 0;
  local_368._M_elems[0xf] = 0;
  local_368._M_elems[8] = 0;
  local_368._M_elems[9] = 0;
  local_368._M_elems[10] = 0;
  local_368._M_elems[0xb] = 0;
  local_368._M_elems[4] = 0;
  local_368._M_elems[5] = 0;
  local_368._M_elems[6] = 0;
  local_368._M_elems[7] = 0;
  local_368._M_elems[0] = 0;
  local_368._M_elems[1] = 0;
  local_368._M_elems[2] = 0;
  local_368._M_elems[3] = 0;
  bufferToBlock(local_3a8,&local_368);
  if (0x38 < uVar5) {
    transform((array<unsigned_int,_5UL> *)(local_398 + 0x10),&local_368,&local_3b0);
    local_368._M_elems[8] = 0;
    local_368._M_elems[9] = 0;
    local_368._M_elems[10] = 0;
    local_368._M_elems[0xb] = 0;
    local_368._M_elems[4] = 0;
    local_368._M_elems[5] = 0;
    local_368._M_elems[6] = 0;
    local_368._M_elems[7] = 0;
    local_368._M_elems[0] = 0;
    local_368._M_elems[1] = 0;
    local_368._M_elems[2] = 0;
    local_368._M_elems[3] = 0;
    local_368._M_elems[0xc] = 0;
    local_368._M_elems[0xd] = 0;
  }
  local_368._M_elems._56_8_ = uVar1 >> 0x20 | uVar1 << 0x20;
  transform((array<unsigned_int,_5UL> *)(local_398 + 0x10),&local_368,&local_3b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  lVar6 = 0;
  do {
    *(uint *)((long)auStack_310 + *(long *)(local_328[0] + -0x18)) =
         *(uint *)((long)auStack_310 + *(long *)(local_328[0] + -0x18)) & 0xffffffb5 | 8;
    lVar2 = *(long *)(local_328[0] + -0x18);
    if (acStack_248[lVar2 + 1] == '\0') {
      std::ios::widen((char)auStack_3b8 + (char)lVar2 + -0x70);
      acStack_248[lVar2 + 1] = '\x01';
    }
    acStack_248[lVar2] = '0';
    *(undefined8 *)((long)local_328 + *(long *)(local_328[0] + -0x18) + 0x10) = 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_328);
    psVar4 = local_370;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_3a8 != (string *)local_398) {
    operator_delete(local_3a8,CONCAT71(local_398._1_7_,local_398[0]) + 1);
  }
  return psVar4;
}

Assistant:

std::string sha1(const std::string &string)
{
    std::array<uint32_t, 5> digest = {0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0};
    std::string buffer;
    uint64_t transforms = 0;
    std::istringstream is(string);

    while (true) {
        std::array<char, BLOCK_BYTES> sbuf = {};

        is.read(sbuf.data(), int64_t(BLOCK_BYTES - buffer.size()));

        buffer.append(sbuf.data(), size_t(is.gcount()));

        if (buffer.size() != BLOCK_BYTES) {
            break;
        }

        std::array<uint32_t, BLOCK_INTS> block = {};

        bufferToBlock(buffer, block);
        transform(digest, block, transforms);

        buffer.clear();
    }

    uint64_t totalBits = (transforms * BLOCK_BYTES + buffer.size()) * 8;

    buffer += "\x80";

    size_t origSize = buffer.size();

    while (buffer.size() < BLOCK_BYTES) {
        buffer += char(0x00);
    }

    std::array<uint32_t, BLOCK_INTS> block = {};

    bufferToBlock(buffer, block);

    if (origSize > BLOCK_BYTES - 8) {
        transform(digest, block, transforms);

        for (size_t i = 0; i < BLOCK_INTS - 2; ++i) {
            block.at(i) = 0;
        }
    }

    block[BLOCK_INTS - 1] = uint32_t(totalBits);
    block[BLOCK_INTS - 2] = uint32_t(totalBits >> 32U);

    transform(digest, block, transforms);

    std::ostringstream result;

    for (uint32_t d : digest) {
        result << std::hex << std::setfill('0') << std::setw(8);
        result << d;
    }

    return result.str();
}